

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void TakeInventory(AActor *activator,char *type,int amount)

{
  int iVar1;
  PClassActor *pPVar2;
  int local_2c;
  int i;
  PClassActor *info;
  char *pcStack_18;
  int amount_local;
  char *type_local;
  AActor *activator_local;
  
  if (type != (char *)0x0) {
    iVar1 = strcmp(type,"Armor");
    pcStack_18 = type;
    if (iVar1 == 0) {
      pcStack_18 = "BasicArmor";
    }
    if ((0 < amount) && (pPVar2 = PClass::FindActor(pcStack_18), pPVar2 != (PClassActor *)0x0)) {
      if (activator == (AActor *)0x0) {
        for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
          if ((playeringame[local_2c] & 1U) != 0) {
            (**(code **)(*(long *)(&players)[(long)local_2c * 0x54] + 0xb0))
                      ((long *)(&players)[(long)local_2c * 0x54],pPVar2,amount,0);
          }
        }
      }
      else {
        (*(activator->super_DThinker).super_DObject._vptr_DObject[0x16])
                  (activator,pPVar2,(ulong)(uint)amount,0);
      }
    }
  }
  return;
}

Assistant:

static void TakeInventory (AActor *activator, const char *type, int amount)
{
	PClassActor *info;

	if (type == NULL)
	{
		return;
	}
	if (strcmp (type, "Armor") == 0)
	{
		type = "BasicArmor";
	}
	if (amount <= 0)
	{
		return;
	}
	info = PClass::FindActor (type);
	if (info == NULL)
	{
		return;
	}
	if (activator == NULL)
	{
		for (int i = 0; i < MAXPLAYERS; ++i)
		{
			if (playeringame[i])
				players[i].mo->TakeInventory(info, amount);
		}
	}
	else
	{
		activator->TakeInventory(info, amount);
	}
}